

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetRemoveOneFanin(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  Wln_Ntk_t *p_00;
  int local_48;
  
  piVar3 = Wln_RetFanins(p,iObj);
  local_48 = -1;
  lVar5 = 0;
  do {
    if (p->pNtk->vFanins[iObj].nSize <= lVar5) {
      return local_48;
    }
    piVar4 = Wln_RetFanins(p,iObj);
    iVar1 = piVar4[lVar5 * 2];
    piVar4 = Wln_RetFanins(p,iObj);
    if ((long)iVar1 != 0) {
      p_00 = p->pNtk;
      if (p_00->vFanins[iVar1].nSize == 0) {
        iVar1 = Wln_ObjIsCi(p_00,iVar1);
        if (iVar1 == 0) goto LAB_00302459;
        p_00 = p->pNtk;
      }
      iVar1 = Wln_ObjIsFf(p_00,iObj);
      if ((lVar5 == 0) || (iVar1 == 0)) {
        if (piVar4[lVar5 * 2 + 1] == 0) {
          __assert_fail("pLink[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1b0,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
        }
        iVar1 = Vec_IntEntry(&p->vEdgeLinks,piVar4[lVar5 * 2 + 1] + 1);
        iVar2 = Vec_IntEntry(&p->vEdgeLinks,piVar4[lVar5 * 2 + 1]);
        piVar3[lVar5 * 2 + 1] = iVar2;
        iVar2 = Wln_ObjIsFf(p->pNtk,iVar1);
        if (iVar2 == 0) {
          __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1b3,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
        }
        if (local_48 == -1) {
          local_48 = iVar1;
        }
      }
    }
LAB_00302459:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int Wln_RetRemoveOneFanin( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        assert( pLink[0] );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pFanins[2*k+1] = Vec_IntEntry( &p->vEdgeLinks, pLink[0] );
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}